

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O3

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* dgrminer::combinations
            (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,vector<int,_std::allocator<int>_> *input,
            size_t combination_size)

{
  bool bVar1;
  size_t sVar2;
  pointer piVar3;
  pointer piVar4;
  ulong *puVar5;
  ulong *puVar6;
  long lVar7;
  ulong uVar8;
  vector<int,_std::allocator<int>_> result;
  allocator_type local_69;
  void *local_68;
  iterator iStack_60;
  int *local_58;
  vector<bool,_std::allocator<bool>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = (void *)((ulong)local_68 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_50,
             (long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(bool *)&local_68,&local_69);
  sVar2 = combination_size + 0x3f;
  if (-1 < (long)combination_size) {
    sVar2 = combination_size;
  }
  puVar5 = local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           ((long)sVar2 >> 6) +
           ((ulong)((combination_size & 0x800000000000003f) < 0x8000000000000001) - 1);
  puVar6 = local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != puVar5) {
    memset(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p,0xff,
           (long)puVar5 -
           (long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    puVar6 = puVar5;
  }
  if ((combination_size & 0x3f) != 0) {
    *puVar6 = *puVar6 | 0xffffffffffffffffU >> (-((byte)combination_size & 0x3f) & 0x3f);
  }
  do {
    local_68 = (void *)0x0;
    iStack_60._M_current = (int *)0x0;
    local_58 = (int *)0x0;
    piVar3 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar4 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar4 != piVar3) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        if ((local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar8 >> 6 & 0x3ffffff] >> (uVar8 & 0x3f) & 1)
            != 0) {
          if (iStack_60._M_current == local_58) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_68,iStack_60,
                       (int *)((long)piVar3 + lVar7));
            piVar3 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar4 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          else {
            *iStack_60._M_current = *(int *)((long)piVar3 + lVar7);
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 4;
      } while (uVar8 < (ulong)((long)piVar4 - (long)piVar3 >> 2));
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_68);
    if (local_68 != (void *)0x0) {
      operator_delete(local_68);
    }
    bVar1 = std::__prev_permutation<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                       local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  } while (bVar1);
  if (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<std::vector<int>> combinations(
		const std::vector<int>& input,
		size_t combination_size
	) {
	  	std::vector<std::vector<int>> results;
	  	std::vector<bool> v(input.size());
	  	std::fill(v.begin(), v.begin() + combination_size, true);

	  	do {
			std::vector<int> result;
			for (int i = 0; i < input.size(); ++i) {
		  		if (v[i]) {
					result.push_back(input[i]);
				}
		  	}
			results.push_back(result);
		} while (std::prev_permutation(v.begin(), v.end()));

	  	return results;
	}